

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier.cpp
# Opt level: O1

bool __thiscall embree::barrier_sys_regression_test::run(barrier_sys_regression_test *this)

{
  void *pvVar1;
  __int_type _Var2;
  uint uVar3;
  iterator iVar4;
  size_t i;
  opaque_thread_t **ppoVar5;
  long lVar6;
  opaque_thread_t **__new_size;
  vector<embree::opaque_thread_t_*,_std::allocator<embree::opaque_thread_t_*>_> threads;
  void *local_58;
  iterator iStack_50;
  opaque_thread_t **local_48;
  thread_t local_38;
  
  LOCK();
  (this->threadID).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->numFailed).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  uVar3 = getNumberOfLogicalThreads();
  __new_size = (opaque_thread_t **)(ulong)uVar3;
  iVar4._M_current = __new_size;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->threadResults,(size_type)__new_size);
  pvVar1 = (this->barrier).opaque;
  *(undefined8 *)((long)pvVar1 + 0x10) = 0;
  *(long *)((long)pvVar1 + 0x18) = (long)__new_size + 1;
  local_48 = (opaque_thread_t **)0x0;
  local_58 = (void *)0x0;
  iStack_50._M_current = (opaque_thread_t **)0x0;
  if (uVar3 != 0) {
    ppoVar5 = __new_size;
    do {
      local_38 = createThread(thread_alloc,this,0,-1);
      iVar4._M_current = iStack_50._M_current;
      if (iStack_50._M_current == local_48) {
        std::vector<embree::opaque_thread_t*,std::allocator<embree::opaque_thread_t*>>::
        _M_realloc_insert<embree::opaque_thread_t*>
                  ((vector<embree::opaque_thread_t*,std::allocator<embree::opaque_thread_t*>> *)
                   &local_58,iStack_50,&local_38);
      }
      else {
        *iStack_50._M_current = local_38;
        iStack_50._M_current = iStack_50._M_current + 1;
      }
      ppoVar5 = (opaque_thread_t **)((long)ppoVar5 + -1);
    } while (ppoVar5 != (opaque_thread_t **)0x0);
  }
  lVar6 = 0;
  do {
    if (__new_size != (opaque_thread_t **)0x0) {
      ppoVar5 = (opaque_thread_t **)0x0;
      do {
        (this->threadResults).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start[(long)ppoVar5] = 0;
        ppoVar5 = (opaque_thread_t **)((long)ppoVar5 + 1);
      } while (__new_size != ppoVar5);
    }
    BarrierSys::wait(&this->barrier,iVar4._M_current);
    BarrierSys::wait(&this->barrier,iVar4._M_current);
    if (__new_size != (opaque_thread_t **)0x0) {
      ppoVar5 = (opaque_thread_t **)0x0;
      do {
        LOCK();
        (this->numFailed).super___atomic_base<unsigned_long>._M_i =
             (this->numFailed).super___atomic_base<unsigned_long>._M_i +
             (ulong)(ppoVar5 !=
                    (opaque_thread_t **)
                    (this->threadResults).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[(long)ppoVar5]);
        UNLOCK();
        ppoVar5 = (opaque_thread_t **)((long)ppoVar5 + 1);
      } while (__new_size != ppoVar5);
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 1000);
  if (__new_size != (opaque_thread_t **)0x0) {
    ppoVar5 = (opaque_thread_t **)0x0;
    do {
      join(*(thread_t *)((long)local_58 + (long)ppoVar5 * 8));
      ppoVar5 = (opaque_thread_t **)((long)ppoVar5 + 1);
    } while (__new_size != ppoVar5);
  }
  _Var2 = (this->numFailed).super___atomic_base<unsigned_long>._M_i;
  if (local_58 != (void *)0x0) {
    operator_delete(local_58);
  }
  return _Var2 == 0;
}

Assistant:

bool run ()
    {
      threadID.store(0);
      numFailed.store(0);

      size_t numThreads = getNumberOfLogicalThreads();
      threadResults.resize(numThreads);
      barrier.init(numThreads+1);

      /* create threads */
      std::vector<thread_t> threads;
      for (size_t i=0; i<numThreads; i++)
        threads.push_back(createThread((thread_func)thread_alloc,this));

      /* run test */ 
      for (size_t i=0; i<1000; i++)
      {
        for (size_t i=0; i<numThreads; i++) threadResults[i] = 0;
        barrier.wait();
        barrier.wait();
        for (size_t i=0; i<numThreads; i++) numFailed += threadResults[i] != i;
      }

      /* destroy threads */
      for (size_t i=0; i<numThreads; i++)
        join(threads[i]);

      return numFailed == 0;
    }